

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

string * __thiscall
libtorrent::combine_path_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view lhs,string_view rhs)

{
  char **this_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  bool bVar1;
  int v;
  size_type sVar2;
  const_reference pvVar3;
  size_type sVar4;
  char *__s;
  size_type sVar5;
  const_pointer pvVar6;
  char *pcVar7;
  size_type sVar8;
  const_pointer pvVar9;
  size_t target_size;
  undefined1 auStack_88 [6];
  bool need_sep;
  char *local_78;
  char *local_70;
  allocator<char> local_51;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_50;
  char *local_40;
  char *local_38;
  undefined1 local_30 [8];
  string_view rhs_local;
  string_view lhs_local;
  string *ret;
  
  rhs_local._M_len = rhs._M_len;
  local_30 = (undefined1  [8])lhs._M_str;
  rhs_local._M_str = (char *)this;
  bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
  if (!bVar1) {
    local_40 = rhs_local._M_str;
    local_38 = (char *)lhs._M_len;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_50,".");
    __x_00._M_str = local_38;
    __x_00._M_len = (size_t)local_40;
    bVar1 = ::std::operator==(__x_00,local_50);
    if (!bVar1) {
      bVar1 = ::std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
      if (!bVar1) {
        local_78 = (char *)local_30;
        local_70 = (char *)rhs_local._M_len;
        ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  ((basic_string_view<char,_std::char_traits<char>_> *)auStack_88,".");
        __x._M_str = local_70;
        __x._M_len = (size_t)local_78;
        bVar1 = ::std::operator==(__x,_auStack_88);
        if (!bVar1) {
          this_00 = &rhs_local._M_str;
          sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
          pvVar3 = ::std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                             ((basic_string_view<char,_std::char_traits<char>_> *)this_00,sVar2 - 1)
          ;
          target_size._6_1_ = *pvVar3 != '/';
          target_size._5_1_ = 0;
          ::std::__cxx11::string::string((string *)__return_storage_ptr__);
          sVar2 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)this_00);
          sVar4 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
          ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
          __s = (char *)::std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
          sVar5 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str);
          pvVar6 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                             ((basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str)
          ;
          pcVar7 = "";
          if ((target_size._6_1_ & 1) != 0) {
            pcVar7 = "/";
          }
          sVar8 = ::std::basic_string_view<char,_std::char_traits<char>_>::size
                            ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
          pvVar9 = ::std::basic_string_view<char,_std::char_traits<char>_>::data
                             ((basic_string_view<char,_std::char_traits<char>_> *)local_30);
          v = snprintf(__s,sVar2 + 2 + sVar4,"%*s%s%*s",sVar5 & 0xffffffff,pvVar6,pcVar7,(int)sVar8,
                       pvVar9);
          aux::numeric_cast<unsigned_long,int,void>(v);
          ::std::__cxx11::string::resize((ulong)__return_storage_ptr__);
          return __return_storage_ptr__;
        }
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)__return_storage_ptr__,
                 (basic_string_view<char,_std::char_traits<char>_> *)&rhs_local._M_str,
                 (allocator<char> *)((long)&target_size + 7));
      ::std::allocator<char>::~allocator((allocator<char> *)((long)&target_size + 7));
      return __return_storage_ptr__;
    }
  }
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             (basic_string_view<char,_std::char_traits<char>_> *)local_30,&local_51);
  ::std::allocator<char>::~allocator(&local_51);
  return __return_storage_ptr__;
}

Assistant:

std::string combine_path(string_view lhs, string_view rhs)
	{
		TORRENT_ASSERT(!is_complete(rhs));
		if (lhs.empty() || lhs == ".") return std::string(rhs);
		if (rhs.empty() || rhs == ".") return std::string(lhs);

#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
#define TORRENT_SEPARATOR "\\"
		bool const need_sep = lhs[lhs.size() - 1] != '\\' && lhs[lhs.size() - 1] != '/';
#else
#define TORRENT_SEPARATOR "/"
		bool const need_sep = lhs[lhs.size() - 1] != '/';
#endif
		std::string ret;
		std::size_t target_size = lhs.size() + rhs.size() + 2;
		ret.resize(target_size);
		target_size = aux::numeric_cast<std::size_t>(std::snprintf(&ret[0], target_size, "%*s%s%*s"
			, int(lhs.size()), lhs.data()
			, (need_sep ? TORRENT_SEPARATOR : "")
			, int(rhs.size()), rhs.data()));
		ret.resize(target_size);
		return ret;
	}